

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O2

void __thiscall Serializer_BigEndian_Test::TestBody(Serializer_BigEndian_Test *this)

{
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_78;
  AssertionResult gtest_ar;
  string local_50;
  Serializer builder;
  
  cfd::core::Serializer::Serializer(&builder);
  cfd::core::Serializer::AddDirectBigEndianNumber(&builder,0x1020304);
  cfd::core::Serializer::Output((ByteData *)&_Stack_78,&builder);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_50,(ByteData *)&_Stack_78);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"01020304\"","builder.Output().GetHex()",
             (char (*) [9])"01020304",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_Stack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_78,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Serializer::~Serializer(&builder);
  return;
}

Assistant:

TEST(Serializer, BigEndian) {
  Serializer builder;
  builder.AddDirectBigEndianNumber(0x01020304);
  EXPECT_EQ("01020304", builder.Output().GetHex());
}